

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O1

int __thiscall pstore::file::deleter_base::unlink(deleter_base *this,char *__name)

{
  int in_EAX;
  ostream *poVar1;
  undefined8 *in_RCX;
  undefined8 *extraout_RDX;
  deleter_base *pdVar2;
  char cStack_1a1;
  ostringstream aoStack_1a0 [112];
  ios_base aiStack_130 [264];
  deleter_base *pdStack_28;
  
  if (this->released_ == false) {
    if ((this->unlinker_).super__Function_base._M_manager == (_Manager_type)0x0) {
      pdVar2 = this;
      std::__throw_bad_function_call();
      pdStack_28 = this;
      std::__cxx11::ostringstream::ostringstream(aoStack_1a0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)aoStack_1a0,(char *)*extraout_RDX,extraout_RDX[1]);
      if (in_RCX[1] != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_1a0," \"",2);
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)aoStack_1a0,(char *)*in_RCX,in_RCX[1]);
        cStack_1a1 = '\"';
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,&cStack_1a1,1);
      }
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(aoStack_1a0);
      std::ios_base::~ios_base(aiStack_130);
      return (int)pdVar2;
    }
    in_EAX = (*(this->unlinker_)._M_invoker)((_Any_data *)&this->unlinker_,&this->path_);
    this->released_ = true;
  }
  return in_EAX;
}

Assistant:

void deleter_base::unlink () {
            if (!released_) {
                unlinker_ (path_);
                released_ = true;
            }
        }